

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxis.cpp
# Opt level: O2

int __thiscall DIS::GridAxis::getMarshalledSize(GridAxis *this)

{
  return 0x18;
}

Assistant:

int GridAxis::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 8;  // _domainInitialXi
   marshalSize = marshalSize + 8;  // _domainFinalXi
   marshalSize = marshalSize + 2;  // _domainPointsXi
   marshalSize = marshalSize + 1;  // _interleafFactor
   marshalSize = marshalSize + 1;  // _axisType
   marshalSize = marshalSize + 2;  // _numberOfPointsOnXiAxis
   marshalSize = marshalSize + 2;  // _initialIndex
    return marshalSize;
}